

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

BIGNUM * BN_bin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *a;
  BIGNUM *pBVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint words;
  uint uVar6;
  bool bVar7;
  ulong uVar5;
  
  if (ret == (BIGNUM *)0x0) {
    a = (BIGNUM *)CRYPTO_zalloc(0x18);
    if (a != (BIGNUM *)0x0) {
      a->flags = 1;
      ret = a;
      goto LAB_00112613;
    }
LAB_001126e8:
    ret = (BIGNUM *)0x0;
  }
  else {
    a = (BIGNUM *)0x0;
LAB_00112613:
    if (len < 1) {
      if (len != 0) {
LAB_00112639:
        uVar6 = len - 1U >> 3;
        uVar4 = (ulong)uVar6;
        words = uVar6 + 1;
        uVar5 = (ulong)words;
        if (((int)uVar6 < ret->dmax) || (pBVar1 = bn_expand2(ret,words), pBVar1 != (BIGNUM *)0x0)) {
          ret->top = words;
          ret->neg = 0;
          uVar6 = len - 1U & 7;
          lVar2 = 0;
          uVar3 = 0;
          do {
            uVar3 = (ulong)s[lVar2] | uVar3 << 8;
            bVar7 = uVar6 == 0;
            uVar6 = uVar6 - 1;
            if (bVar7) {
              uVar5 = (ulong)((int)uVar5 - 1);
              ret->d[uVar5] = uVar3;
              uVar6 = 7;
              uVar3 = 0;
            }
            lVar2 = lVar2 + 1;
          } while (len != (int)lVar2);
          do {
            if (ret->d[uVar4] != 0) {
              ret->top = (int)uVar4 + 1;
              if ((int)uVar4 != -1) {
                return ret;
              }
              goto LAB_001126da;
            }
            uVar4 = uVar4 - 1;
          } while (1 < (int)uVar4 + 2);
          ret->top = 0;
LAB_001126da:
          ret->neg = 0;
          return ret;
        }
        BN_free(a);
        goto LAB_001126e8;
      }
    }
    else {
      do {
        if (*s != '\0') goto LAB_00112639;
        s = s + 1;
        bVar7 = 1 < len;
        len = len + -1;
      } while (bVar7);
    }
    ret->top = 0;
  }
  return ret;
}

Assistant:

BIGNUM *BN_bin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    /* Skip leading zero's. */
    for ( ; len > 0 && *s == 0; s++, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return (ret);
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        l = (l << 8L) | *(s++);
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return (ret);
}